

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws-spa.c
# Opt level: O1

int lws_urldecode_s_destroy(lws_spa *spa,lws_urldecode_stateful *s)

{
  int iVar1;
  void *pvVar2;
  
  if (s->state == US_IDLE) {
    (*s->output)(s->data,s->name,&s->out,s->pos,1);
  }
  iVar1 = (*s->output)(s->data,s->name,(char **)0x0,0,3);
  if ((iVar1 == 0) && ((spa->i).ac == (lwsac **)0x0)) {
    pvVar2 = lws_realloc(s,0,"lws_free");
    return (int)pvVar2;
  }
  return iVar1;
}

Assistant:

static int
lws_urldecode_s_destroy(struct lws_spa *spa, struct lws_urldecode_stateful *s)
{
	int ret = 0;

	if (s->state != US_IDLE)
		ret = -1;

	if (!ret)
		if (s->output(s->data, s->name, &s->out, s->pos,
			      LWS_UFS_FINAL_CONTENT))
			ret = -1;

	if (s->output(s->data, s->name, NULL, 0, LWS_UFS_CLOSE))
		return -1;

	if (!spa->i.ac)
		lws_free(s);

	return ret;
}